

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_0::MergingIterator::SeekToLast(MergingIterator *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < this->n_; lVar3 = lVar3 + 1) {
    IteratorWrapper::SeekToLast((IteratorWrapper *)((long)&this->children_->iter_ + lVar2));
    lVar2 = lVar2 + 0x20;
  }
  FindLargest(this);
  this->direction_ = kReverse;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SeekToLast() override {
    for (int i = 0; i < n_; i++) {
      children_[i].SeekToLast();
    }
    FindLargest();
    direction_ = kReverse;
  }